

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O1

void __thiscall SubprocessTestSetWithMulti::Run(SubprocessTestSetWithMulti *this)

{
  Test *pTVar1;
  SubprocessTestSetWithMulti *pSVar2;
  bool bVar3;
  int iVar4;
  ExitStatus EVar5;
  Subprocess *pSVar6;
  string *psVar7;
  size_type sVar8;
  int i;
  long lVar9;
  Subprocess *processes [3];
  char *kCommands [3];
  allocator<char> local_99;
  SubprocessTestSetWithMulti *local_98;
  SubprocessSet *local_90;
  Subprocess *local_88 [4];
  string local_68;
  char *local_48 [3];
  
  local_48[0] = "ls /";
  local_48[1] = "id -u";
  local_48[2] = "pwd";
  local_90 = &(this->super_SubprocessTest).subprocs_;
  lVar9 = 0;
  local_98 = this;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,local_48[lVar9],&local_99);
    pSVar6 = SubprocessSet::Add(local_90,&local_68,false);
    local_88[lVar9] = pSVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar3 = testing::Test::Check
                      (g_current_test,pSVar6 != (Subprocess *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0xe7,"(Subprocess *) 0 != processes[i]");
    if (!bVar3) goto LAB_0018b6fb;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  bVar3 = testing::Test::Check
                    (g_current_test,
                     (long)(local_98->super_SubprocessTest).subprocs_.running_.
                           super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(local_98->super_SubprocessTest).subprocs_.running_.
                           super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                           super__Vector_impl_data._M_start == 0x18,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0xea,"3u == subprocs_.running_.size()");
  if (bVar3) {
    lVar9 = 0;
    do {
      pTVar1 = g_current_test;
      pSVar6 = local_88[lVar9];
      bVar3 = Subprocess::Done(pSVar6);
      bVar3 = testing::Test::Check
                        (pTVar1,!bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                         ,0xec,"processes[i]->Done()");
      pTVar1 = g_current_test;
      if (!bVar3) goto LAB_0018b6fb;
      psVar7 = Subprocess::GetOutput_abi_cxx11_(pSVar6);
      iVar4 = std::__cxx11::string::compare((char *)psVar7);
      bVar3 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                         ,0xed,"\"\" == processes[i]->GetOutput()");
      pSVar2 = local_98;
      if (!bVar3) goto LAB_0018b6fb;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    (local_98->super_SubprocessTest).subprocs_.token_available_ = false;
    local_88[3] = local_88[2];
    while (((bVar3 = Subprocess::Done(local_88[0]), !bVar3 ||
            (bVar3 = Subprocess::Done(local_88[1]), !bVar3)) ||
           (bVar3 = Subprocess::Done(local_88[3]), !bVar3))) {
      bVar3 = testing::Test::Check
                        (g_current_test,
                         (pSVar2->super_SubprocessTest).subprocs_.running_.
                         super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                         super__Vector_impl_data._M_finish !=
                         (pSVar2->super_SubprocessTest).subprocs_.running_.
                         super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                         ,0xf3,"subprocs_.running_.size() > 0u");
      if (!bVar3) goto LAB_0018b6fb;
      SubprocessSet::DoWork(local_90,(TokenPool *)0x0);
    }
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (bool)((pSVar2->super_SubprocessTest).subprocs_.token_available_ ^ 1),
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0xf6,"subprocs_.IsTokenAvailable()");
    if ((bVar3) &&
       (bVar3 = testing::Test::Check
                          (g_current_test,
                           (pSVar2->super_SubprocessTest).subprocs_.running_.
                           super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                           super__Vector_impl_data._M_finish ==
                           (pSVar2->super_SubprocessTest).subprocs_.running_.
                           super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                           ,0xf7,"0u == subprocs_.running_.size()"), pTVar1 = g_current_test, bVar3)
       ) {
      sVar8 = std::queue<Subprocess_*,_std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>_>::
              size(&(pSVar2->super_SubprocessTest).subprocs_.finished_);
      bVar3 = testing::Test::Check
                        (pTVar1,sVar8 == 3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                         ,0xf8,"3u == subprocs_.finished_.size()");
      if (bVar3) {
        lVar9 = 0;
        goto LAB_0018b653;
      }
    }
  }
LAB_0018b6fb:
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
LAB_0018b653:
  pTVar1 = g_current_test;
  pSVar6 = local_88[lVar9];
  EVar5 = Subprocess::Finish(pSVar6);
  bVar3 = testing::Test::Check
                    (pTVar1,EVar5 == ExitSuccess,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0xfb,"ExitSuccess == processes[i]->Finish()");
  pTVar1 = g_current_test;
  if (!bVar3) goto LAB_0018b6fb;
  psVar7 = Subprocess::GetOutput_abi_cxx11_(pSVar6);
  iVar4 = std::__cxx11::string::compare((char *)psVar7);
  bVar3 = testing::Test::Check
                    (pTVar1,iVar4 != 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0xfc,"\"\" != processes[i]->GetOutput()");
  if (!bVar3) goto LAB_0018b6fb;
  Subprocess::~Subprocess(pSVar6);
  operator_delete(pSVar6,0x30);
  lVar9 = lVar9 + 1;
  if (lVar9 == 3) {
    return;
  }
  goto LAB_0018b653;
}

Assistant:

TEST_F(SubprocessTest, SetWithMulti) {
  Subprocess* processes[3];
  const char* kCommands[3] = {
    kSimpleCommand,
#ifdef _WIN32
    "cmd /c echo hi",
    "cmd /c time /t",
#else
    "id -u",
    "pwd",
#endif
  };

  for (int i = 0; i < 3; ++i) {
    processes[i] = subprocs_.Add(kCommands[i]);
    ASSERT_NE((Subprocess *) 0, processes[i]);
  }

  ASSERT_EQ(3u, subprocs_.running_.size());
  for (int i = 0; i < 3; ++i) {
    ASSERT_FALSE(processes[i]->Done());
    ASSERT_EQ("", processes[i]->GetOutput());
  }

  subprocs_.ResetTokenAvailable();
  while (!processes[0]->Done() || !processes[1]->Done() ||
         !processes[2]->Done()) {
    ASSERT_GT(subprocs_.running_.size(), 0u);
    subprocs_.DoWork(NULL);
  }
  ASSERT_FALSE(subprocs_.IsTokenAvailable());
  ASSERT_EQ(0u, subprocs_.running_.size());
  ASSERT_EQ(3u, subprocs_.finished_.size());

  for (int i = 0; i < 3; ++i) {
    ASSERT_EQ(ExitSuccess, processes[i]->Finish());
    ASSERT_NE("", processes[i]->GetOutput());
    delete processes[i];
  }
}